

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::resetColImpliedBoundsDerivedFromRow(HPresolve *this,HighsInt row)

{
  bool bVar1;
  int in_ESI;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDI;
  HighsInt *col;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> affectedCols;
  HPresolve *in_stack_ffffffffffffff90;
  _Self local_58;
  _Self local_50;
  undefined1 *local_48;
  undefined1 local_40 [52];
  int local_c;
  
  local_c = in_ESI;
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)&in_RDI[0xd]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(long)in_ESI);
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x6eef2f);
  if (!bVar1) {
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)&in_RDI[0xd]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (long)local_c);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff90,in_RDI);
    local_48 = local_40;
    local_50._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_RDI)
    ;
    local_58._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_RDI);
    while (bVar1 = std::operator!=(&local_50,&local_58), bVar1) {
      std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x6eefa3);
      resetColImpliedBounds
                (in_stack_ffffffffffffff90,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff90);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x6eeff0);
  }
  return;
}

Assistant:

void HPresolve::resetColImpliedBoundsDerivedFromRow(HighsInt row) {
  // reset implied column bounds affected by a modification in a row
  // (removed / added non-zeros, etc.)
  if (colImplSourceByRow[row].empty()) return;
  std::set<HighsInt> affectedCols(colImplSourceByRow[row]);
  for (const HighsInt& col : affectedCols) {
    // set implied bounds to infinite values if they were deduced from the
    // given row
    resetColImpliedBounds(col, row);
  }
}